

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrBindingModificationsKHR *value)

{
  pointer *this;
  pointer *this_00;
  XrBindingModificationBaseHeaderKHR **ppXVar1;
  XrResult XVar2;
  allocator local_429;
  string local_428 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_408;
  allocator local_3e9;
  string local_3e8 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3c8;
  allocator local_3a9;
  string local_3a8 [32];
  __cxx11 local_388 [39];
  allocator local_361;
  string local_360 [8];
  string error_message_3;
  XrInteractionProfileAnalogThresholdVALVE **new_interactionprofileanalogthresholdvalve_value;
  allocator local_319;
  string local_318 [32];
  __cxx11 local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [8];
  string error_message_2;
  XrInteractionProfileDpadBindingEXT **new_interactionprofiledpadbindingext_value;
  allocator local_289;
  string local_288 [32];
  __cxx11 local_268 [39];
  allocator local_241;
  string local_240 [8];
  string error_message_1;
  uint local_220;
  allocator local_219;
  uint32_t value_bindingmodifications_inc;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_190;
  allocator local_171;
  string local_170 [32];
  undefined1 local_150 [40];
  string local_128 [8];
  string error_message;
  allocator local_101;
  string local_100 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_e0;
  allocator local_c1;
  string local_c0 [52];
  NextChainResult local_8c;
  undefined1 local_88 [4];
  NextChainResult next_result;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  XrResult xr_result;
  XrBindingModificationsKHR *value_local;
  bool check_pnext_local;
  bool check_members_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  if (value->type != XR_TYPE_BINDING_MODIFICATIONS_KHR) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrBindingModificationsKHR",value->type,
               "VUID-XrBindingModificationsKHR-type-type",XR_TYPE_BINDING_MODIFICATIONS_KHR,
               "XR_TYPE_BINDING_MODIFICATIONS_KHR");
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  if (check_pnext) {
    this = &duplicate_ext_structs.
            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this);
    this_00 = &encountered_structs.
               super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this_00);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    local_8c = ValidateNextChain(instance_info,command_name,objects_info,value->next,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)this,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)
                                 local_88,(vector<XrStructureType,_std::allocator<XrStructureType>_>
                                           *)this_00);
    if (local_8c == NEXT_CHAIN_RESULT_ERROR) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c0,"VUID-XrBindingModificationsKHR-next-next",&local_c1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_e0,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_100,
                 "Invalid structure(s) in \"next\" chain for XrBindingModificationsKHR struct \"next\""
                 ,&local_101);
      CoreValidLogMessage(instance_info,(string *)local_c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_e0,(string *)local_100);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_e0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (local_8c == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_128,"Multiple structures of the same type(s) in \"next\" chain for ",
                 (allocator *)(local_150 + 0x27));
      std::allocator<char>::~allocator((allocator<char> *)(local_150 + 0x27));
      std::__cxx11::string::operator+=(local_128,"XrBindingModificationsKHR : ");
      StructTypesToString_abi_cxx11_
                ((GenValidUsageXrInstanceInfo *)local_150,
                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)instance_info);
      std::__cxx11::string::operator+=(local_128,(string *)local_150);
      std::__cxx11::string::~string((string *)local_150);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_170,"VUID-XrBindingModificationsKHR-next-unique",&local_171);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_190,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1b0,
                 "Multiple structures of the same type(s) in \"next\" chain for XrBindingModificationsKHR struct"
                 ,&local_1b1);
      CoreValidLogMessage(instance_info,(string *)local_170,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_190,(string *)local_1b0);
      std::__cxx11::string::~string(local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_190);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::string::~string(local_128);
    }
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  if ((check_members) &&
     (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS)) {
    if ((value->bindingModificationCount == 0) ||
       (value->bindingModifications != (XrBindingModificationBaseHeaderKHR **)0x0)) {
      if (value->bindingModifications != (XrBindingModificationBaseHeaderKHR **)0x0) {
        for (local_220 = 0; local_220 < value->bindingModificationCount; local_220 = local_220 + 1)
        {
          if (value->bindingModifications[local_220] == (XrBindingModificationBaseHeaderKHR *)0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_240,"Structure XrBindingModificationsKHR member bindingModifications",
                       &local_241);
            std::allocator<char>::~allocator((allocator<char> *)&local_241);
            std::__cxx11::string::operator+=(local_240,"[");
            std::__cxx11::to_string(local_268,local_220);
            std::__cxx11::string::operator+=(local_240,(string *)local_268);
            std::__cxx11::string::~string((string *)local_268);
            std::__cxx11::string::operator+=(local_240,"]");
            std::__cxx11::string::operator+=(local_240," is null");
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_288,"VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                       &local_289);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &new_interactionprofiledpadbindingext_value,objects_info);
            CoreValidLogMessage(instance_info,(string *)local_288,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                                command_name,
                                (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                 *)&new_interactionprofiledpadbindingext_value,(string *)local_240);
            std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
            ~vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *
                    )&new_interactionprofiledpadbindingext_value);
            std::__cxx11::string::~string(local_288);
            std::allocator<char>::~allocator((allocator<char> *)&local_289);
            std::__cxx11::string::~string(local_240);
            return XR_ERROR_VALIDATION_FAILURE;
          }
          if (((value->bindingModifications == (XrBindingModificationBaseHeaderKHR **)0x0) ||
              (ppXVar1 = value->bindingModifications,
              ppXVar1[local_220]->type != XR_TYPE_INTERACTION_PROFILE_DPAD_BINDING_EXT)) ||
             (ppXVar1 == (XrBindingModificationBaseHeaderKHR **)0x0)) {
            if (((value->bindingModifications == (XrBindingModificationBaseHeaderKHR **)0x0) ||
                (ppXVar1 = value->bindingModifications,
                ppXVar1[local_220]->type != XR_TYPE_INTERACTION_PROFILE_ANALOG_THRESHOLD_VALVE)) ||
               (ppXVar1 == (XrBindingModificationBaseHeaderKHR **)0x0)) {
              if ((value->bindingModifications[local_220] !=
                   (XrBindingModificationBaseHeaderKHR *)0x0) &&
                 (valid_ext_structs.
                  super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_ =
                       ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                        value->bindingModifications[local_220]),
                 valid_ext_structs.
                 super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ != XR_SUCCESS)) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_3e8,"VUID-XrBindingModificationsKHR-bindingModifications-parameter"
                           ,&local_3e9);
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                vector(&local_408,objects_info);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_428,
                           "Structure XrBindingModificationsKHR member bindingModifications is invalid"
                           ,&local_429);
                CoreValidLogMessage(instance_info,(string *)local_3e8,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_408,
                                    (string *)local_428);
                std::__cxx11::string::~string(local_428);
                std::allocator<char>::~allocator((allocator<char> *)&local_429);
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                ~vector(&local_408);
                std::__cxx11::string::~string(local_3e8);
                std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
                return valid_ext_structs.
                       super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage._4_4_;
              }
            }
            else {
              XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                       (XrInteractionProfileAnalogThresholdVALVE *)
                                       ppXVar1[local_220]);
              if (XVar2 != XR_SUCCESS) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_360,
                           "Structure XrBindingModificationsKHR member bindingModifications",
                           &local_361);
                std::allocator<char>::~allocator((allocator<char> *)&local_361);
                std::__cxx11::string::operator+=(local_360,"[");
                std::__cxx11::to_string(local_388,local_220);
                std::__cxx11::string::operator+=(local_360,(string *)local_388);
                std::__cxx11::string::~string((string *)local_388);
                std::__cxx11::string::operator+=(local_360,"]");
                std::__cxx11::string::operator+=(local_360," is invalid");
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_3a8,"VUID-XrBindingModificationsKHR-bindingModifications-parameter"
                           ,&local_3a9);
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                vector(&local_3c8,objects_info);
                CoreValidLogMessage(instance_info,(string *)local_3a8,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_3c8,
                                    (string *)local_360);
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                ~vector(&local_3c8);
                std::__cxx11::string::~string(local_3a8);
                std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
                std::__cxx11::string::~string(local_360);
                return XR_ERROR_VALIDATION_FAILURE;
              }
              valid_ext_structs.
              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
            }
          }
          else {
            XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                     (XrInteractionProfileDpadBindingEXT *)ppXVar1[local_220]);
            if (XVar2 != XR_SUCCESS) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_2d0,"Structure XrBindingModificationsKHR member bindingModifications"
                         ,&local_2d1);
              std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
              std::__cxx11::string::operator+=(local_2d0,"[");
              std::__cxx11::to_string(local_2f8,local_220);
              std::__cxx11::string::operator+=(local_2d0,(string *)local_2f8);
              std::__cxx11::string::~string((string *)local_2f8);
              std::__cxx11::string::operator+=(local_2d0,"]");
              std::__cxx11::string::operator+=(local_2d0," is invalid");
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        (local_318,"VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                         &local_319);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&new_interactionprofileanalogthresholdvalve_value,objects_info);
              CoreValidLogMessage(instance_info,(string *)local_318,VALID_USAGE_DEBUG_SEVERITY_ERROR
                                  ,command_name,
                                  (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                   *)&new_interactionprofileanalogthresholdvalve_value,
                                  (string *)local_2d0);
              std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
              ~vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                       *)&new_interactionprofileanalogthresholdvalve_value);
              std::__cxx11::string::~string(local_318);
              std::allocator<char>::~allocator((allocator<char> *)&local_319);
              std::__cxx11::string::~string(local_2d0);
              return XR_ERROR_VALIDATION_FAILURE;
            }
            valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
          }
        }
      }
      instance_info_local._4_4_ =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1d8,"VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                 &local_1d9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_1f8,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&value_bindingmodifications_inc,
                 "Structure XrBindingModificationsKHR member bindingModificationCount is NULL, but value->bindingModificationCount is greater than 0"
                 ,&local_219);
      CoreValidLogMessage(instance_info,(string *)local_1d8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_1f8,(string *)&value_bindingmodifications_inc);
      std::__cxx11::string::~string((string *)&value_bindingmodifications_inc);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_1f8);
      std::__cxx11::string::~string(local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
    }
  }
  else {
    instance_info_local._4_4_ =
         valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  return instance_info_local._4_4_;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrBindingModificationsKHR* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_BINDING_MODIFICATIONS_KHR) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrBindingModificationsKHR",
                             value->type, "VUID-XrBindingModificationsKHR-type-type", XR_TYPE_BINDING_MODIFICATIONS_KHR, "XR_TYPE_BINDING_MODIFICATIONS_KHR");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrBindingModificationsKHR struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrBindingModificationsKHR : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrBindingModificationsKHR struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Optional array must be non-NULL when value->bindingModificationCount is non-zero
    if (0 != value->bindingModificationCount && nullptr == value->bindingModifications) {
        CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrBindingModificationsKHR member bindingModificationCount is NULL, but value->bindingModificationCount is greater than 0");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->bindingModifications) {
        for (uint32_t value_bindingmodifications_inc = 0; value_bindingmodifications_inc < value->bindingModificationCount; ++value_bindingmodifications_inc) {
            if (value->bindingModifications[value_bindingmodifications_inc] == nullptr) {
                std::string error_message = "Structure XrBindingModificationsKHR member bindingModifications";
                error_message += "[";
                error_message += std::to_string(value_bindingmodifications_inc);
                error_message += "]";
                error_message += " is null";
                CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
            // Validate if XrBindingModificationBaseHeaderKHR is a child structure of type XrInteractionProfileDpadBindingEXT and it is valid
            {
                if (value->bindingModifications != nullptr) {
                    const XrInteractionProfileDpadBindingEXT* const* new_interactionprofiledpadbindingext_value = reinterpret_cast<const XrInteractionProfileDpadBindingEXT* const*>(value->bindingModifications);
                    if (new_interactionprofiledpadbindingext_value[value_bindingmodifications_inc]->type == XR_TYPE_INTERACTION_PROFILE_DPAD_BINDING_EXT) {
                        if (nullptr != new_interactionprofiledpadbindingext_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_interactionprofiledpadbindingext_value[value_bindingmodifications_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrBindingModificationsKHR member bindingModifications";
                                error_message += "[";
                                error_message += std::to_string(value_bindingmodifications_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate if XrBindingModificationBaseHeaderKHR is a child structure of type XrInteractionProfileAnalogThresholdVALVE and it is valid
            {
                if (value->bindingModifications != nullptr) {
                    const XrInteractionProfileAnalogThresholdVALVE* const* new_interactionprofileanalogthresholdvalve_value = reinterpret_cast<const XrInteractionProfileAnalogThresholdVALVE* const*>(value->bindingModifications);
                    if (new_interactionprofileanalogthresholdvalve_value[value_bindingmodifications_inc]->type == XR_TYPE_INTERACTION_PROFILE_ANALOG_THRESHOLD_VALVE) {
                        if (nullptr != new_interactionprofileanalogthresholdvalve_value) {
                            xr_result = ValidateXrStruct(instance_info, command_name,
                                                                            objects_info, check_members, true, new_interactionprofileanalogthresholdvalve_value[value_bindingmodifications_inc]);
                            if (XR_SUCCESS != xr_result) {
                                std::string error_message = "Structure XrBindingModificationsKHR member bindingModifications";
                                error_message += "[";
                                error_message += std::to_string(value_bindingmodifications_inc);
                                error_message += "]";
                                error_message += " is invalid";
                                CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                                    objects_info,
                                                    error_message);
                                return XR_ERROR_VALIDATION_FAILURE;
                                break;
                            } else {
                                continue;
                                }
                            }
                    }
                }
            }
            // Validate that the base-structure XrBindingModificationBaseHeaderKHR is valid
            if (nullptr != value->bindingModifications[value_bindingmodifications_inc]) {
                xr_result = ValidateXrStruct(instance_info, command_name,
                                                                objects_info, check_members, true, value->bindingModifications[value_bindingmodifications_inc]);
                if (XR_SUCCESS != xr_result) {
                    CoreValidLogMessage(instance_info, "VUID-XrBindingModificationsKHR-bindingModifications-parameter",
                                        VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                        objects_info,
                                        "Structure XrBindingModificationsKHR member bindingModifications is invalid");
                    return xr_result;
                }
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}